

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexTimer.h
# Opt level: O0

bool __thiscall
SimplexTimer::reportSimplexClockList
          (SimplexTimer *this,char *grepStamp,vector<int,_std::allocator<int>_> *simplex_clock_list,
          HighsTimerClock *simplex_timer_clock,double tolerance_percent_report_)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *this_00;
  long *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  double tolerance_percent_report;
  double ideal_sum_time;
  HighsInt en;
  vector<int,_std::allocator<int>_> clockList;
  vector<int,_std::allocator<int>_> *in_stack_00000078;
  HighsInt simplex_clock_list_size;
  vector<int,_std::allocator<int>_> *clock;
  HighsTimer *timer_pointer;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  value_type vVar5;
  vector<int,_std::allocator<int>_> *this_01;
  int local_68;
  vector<int,_std::allocator<int>_> local_58;
  int local_3c;
  vector<int,_std::allocator<int>_> *local_38;
  long local_30;
  
  local_30 = *in_RCX;
  local_38 = (vector<int,_std::allocator<int>_> *)(in_RCX + 1);
  this_01 = in_RDX;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  local_3c = (int)sVar2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x784181);
  std::vector<int,_std::allocator<int>_>::resize
            (this_01,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  for (local_68 = 0; local_68 < local_3c; local_68 = local_68 + 1) {
    in_stack_ffffffffffffff60 = local_38;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_68);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffff60,(long)*pvVar3);
    vVar5 = *pvVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_68);
    *pvVar4 = vVar5;
  }
  this_00 = (vector<double,_std::allocator<double>_> *)(local_30 + 0x48);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_38,0);
  std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar3);
  bVar1 = HighsTimer::reportOnTolerance
                    (timer_pointer,(char *)clock,in_stack_00000078,
                     (double)clockList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                     (double)clockList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff60);
  return bVar1;
}

Assistant:

bool reportSimplexClockList(const char* grepStamp,
                              const std::vector<HighsInt> simplex_clock_list,
                              const HighsTimerClock& simplex_timer_clock,
                              const double tolerance_percent_report_ = -1) {
    HighsTimer* timer_pointer = simplex_timer_clock.timer_pointer_;
    const std::vector<HighsInt>& clock = simplex_timer_clock.clock_;
    HighsInt simplex_clock_list_size = simplex_clock_list.size();
    std::vector<HighsInt> clockList;
    clockList.resize(simplex_clock_list_size);
    for (HighsInt en = 0; en < simplex_clock_list_size; en++) {
      clockList[en] = clock[simplex_clock_list[en]];
    }
    const double ideal_sum_time =
        timer_pointer->clock_time[clock[SimplexTotalClock]];
    const double tolerance_percent_report =
        tolerance_percent_report_ >= 0 ? tolerance_percent_report_ : 1e-8;
    return timer_pointer->reportOnTolerance(
        grepStamp, clockList, ideal_sum_time, tolerance_percent_report);
  }